

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

void * mspace_memalign(mspace msp,size_t alignment,size_t bytes)

{
  mchunkptr pmVar1;
  byte *pbVar2;
  void *pvVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  mchunkptr p;
  ulong uVar8;
  
  if (alignment < 0x11) {
    pvVar3 = mspace_malloc(msp,bytes);
    return pvVar3;
  }
  if (alignment < 0x21) {
    alignment = 0x20;
  }
  uVar8 = 0x20;
  uVar5 = alignment;
  if ((alignment - 1 & alignment) != 0) {
    do {
      uVar5 = uVar8;
      uVar8 = uVar5 * 2;
    } while (uVar5 < alignment);
  }
  if (bytes < -uVar5 - 0x80) {
    uVar8 = 0x20;
    if (0x16 < bytes) {
      uVar8 = bytes + 0x17 & 0xfffffffffffffff0;
    }
    pvVar3 = mspace_malloc(msp,uVar8 + 0x18 + uVar5);
    if (pvVar3 != (void *)0x0) {
      p = (mchunkptr)((long)pvVar3 + -0x10);
      if ((uVar5 - 1 & (ulong)pvVar3) != 0) {
        uVar6 = -uVar5 & (long)pvVar3 + (uVar5 - 1);
        uVar7 = 0;
        if ((uVar6 - 0x10) - (long)p < 0x20) {
          uVar7 = uVar5;
        }
        pmVar1 = (mchunkptr)((uVar6 - 0x10) + uVar7);
        uVar7 = (long)pmVar1 - (long)p;
        uVar5 = (*(ulong *)((long)pvVar3 + -8) & 0xfffffffffffffff8) - uVar7;
        if ((*(ulong *)((long)pvVar3 + -8) & 3) == 0) {
          pmVar1->prev_foot = uVar7 + p->prev_foot;
          pmVar1->head = uVar5;
          p = pmVar1;
        }
        else {
          pmVar1->head = (uint)pmVar1->head & 1 | uVar5 | 2;
          pbVar2 = (byte *)((long)pmVar1 + uVar5 + 8);
          *pbVar2 = *pbVar2 | 1;
          *(ulong *)((long)pvVar3 + -8) = (uint)*(undefined8 *)((long)pvVar3 + -8) & 1 | uVar7 | 2;
          pbVar2 = (byte *)((long)pvVar3 + (uVar7 - 8));
          *pbVar2 = *pbVar2 | 1;
          dispose_chunk((mstate)msp,p,uVar7);
          p = pmVar1;
        }
      }
      uVar5 = p->head;
      if (((uVar5 & 3) != 0) && (uVar7 = uVar5 & 0xfffffffffffffff8, uVar8 + 0x20 < uVar7)) {
        p->head = uVar8 + 2 + (ulong)((uint)uVar5 & 1);
        *(ulong *)((long)&p->head + uVar8) = uVar7 - uVar8 | 3;
        pbVar2 = (byte *)((long)&p->head + uVar7);
        *pbVar2 = *pbVar2 | 1;
        dispose_chunk((mstate)msp,(mchunkptr)((long)&p->prev_foot + uVar8),uVar7 - uVar8);
      }
      return &p->fd;
    }
  }
  else if (msp != (mspace)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0xc;
  }
  return (void *)0x0;
}

Assistant:

void* mspace_memalign(mspace msp, size_t alignment, size_t bytes) {
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
    return 0;
  }
  if (alignment <= MALLOC_ALIGNMENT)
    return mspace_malloc(msp, bytes);
  return internal_memalign(ms, alignment, bytes);
}